

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extend<8ul,unsigned_char,unsigned_short,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  uint uVar1;
  reference this_00;
  reference this_01;
  Literal local_290;
  size_type local_278;
  size_t idx;
  size_t i;
  undefined1 local_258 [8];
  LaneArray<8UL> result;
  LaneArray<8UL_*_2> lanes;
  Literal *vec_local;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)&result._M_elems[7].type,this,vec);
  std::array<wasm::Literal,_8UL>::array((array<wasm::Literal,_8UL> *)local_258);
  for (idx = 0; idx < 8; idx = idx + 1) {
    local_278 = idx + 8;
    this_00 = std::array<wasm::Literal,_16UL>::operator[]
                        ((array<wasm::Literal,_16UL> *)&result._M_elems[7].type,local_278);
    uVar1 = Literal::geti32(this_00);
    Literal::Literal(&local_290,uVar1 & 0xff);
    this_01 = std::array<wasm::Literal,_8UL>::operator[]((array<wasm::Literal,_8UL> *)local_258,idx)
    ;
    Literal::operator=(this_01,&local_290);
    Literal::~Literal(&local_290);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)local_258);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_258);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&result._M_elems[7].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}